

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O2

void __thiscall
VectorSUnitTest_pop_back_Test::VectorSUnitTest_pop_back_Test(VectorSUnitTest_pop_back_Test *this)

{
  VectorSUnitTest::VectorSUnitTest(&this->super_VectorSUnitTest);
  (this->super_VectorSUnitTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_0016a530;
  return;
}

Assistant:

TEST_F(VectorSUnitTest, pop_back)
{
    vector_s<unsigned, 12> v{0u, 1u, 2u, 3u, 4u, 5u};
    EXPECT_EQ(6u, v.size());
    EXPECT_EQ(5u, v.back());

    v.pop_back();
    EXPECT_EQ(4u, v.back());
    EXPECT_EQ(5u, v.size());

    v.pop_back();
    EXPECT_EQ(3u, v.back());
    EXPECT_EQ(4u, v.size());
}